

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O0

operand skiwi::get_byte_mem_operand(operand reg)

{
  runtime_error *this;
  operand local_c;
  operand reg_local;
  
  switch(reg) {
  case RAX:
    local_c = BYTE_MEM_RAX;
    break;
  case RBX:
    local_c = BYTE_MEM_RBX;
    break;
  case RCX:
    local_c = BYTE_MEM_RCX;
    break;
  case RDX:
    local_c = BYTE_MEM_RDX;
    break;
  case RSI:
    local_c = BYTE_MEM_RSI;
    break;
  case RDI:
    local_c = BYTE_MEM_RDI;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"not implemented");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case R8:
    local_c = BYTE_MEM_R8;
    break;
  case R9:
    local_c = BYTE_MEM_R9;
    break;
  case R10:
    local_c = BYTE_MEM_R10;
    break;
  case R11:
    local_c = BYTE_MEM_R11;
    break;
  case R12:
    local_c = BYTE_MEM_R12;
    break;
  case R13:
    local_c = BYTE_MEM_R13;
    break;
  case R14:
    local_c = BYTE_MEM_R14;
    break;
  case R15:
    local_c = BYTE_MEM_R15;
  }
  return local_c;
}

Assistant:

asmcode::operand get_byte_mem_operand(asmcode::operand reg)
  {
  switch (reg)
    {
    case asmcode::RAX: return asmcode::BYTE_MEM_RAX;
    case asmcode::RBX: return asmcode::BYTE_MEM_RBX;
    case asmcode::RCX: return asmcode::BYTE_MEM_RCX;
    case asmcode::RDX: return asmcode::BYTE_MEM_RDX;
    case asmcode::RSI: return asmcode::BYTE_MEM_RSI;
    case asmcode::RDI: return asmcode::BYTE_MEM_RDI;
    case asmcode::R8: return asmcode::BYTE_MEM_R8;
    case asmcode::R9: return asmcode::BYTE_MEM_R9;
    case asmcode::R10: return asmcode::BYTE_MEM_R10;
    case asmcode::R11: return asmcode::BYTE_MEM_R11;
    case asmcode::R12: return asmcode::BYTE_MEM_R12;
    case asmcode::R13: return asmcode::BYTE_MEM_R13;
    case asmcode::R14: return asmcode::BYTE_MEM_R14;
    case asmcode::R15: return asmcode::BYTE_MEM_R15;
    default: throw std::runtime_error("not implemented");
    }
  }